

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrix3x3.h
# Opt level: O0

void __thiscall
btMatrix3x3::diagonalize(btMatrix3x3 *this,btMatrix3x3 *rot,btScalar threshold,int maxSteps)

{
  bool bVar1;
  btScalar *pbVar2;
  btVector3 *this_00;
  int in_EDX;
  btMatrix3x3 *in_RSI;
  btMatrix3x3 *in_RDI;
  float in_XMM0_Da;
  btScalar bVar3;
  btScalar bVar4;
  btScalar bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  btVector3 *row;
  int i;
  btScalar mrq;
  btScalar mrp;
  btScalar sin;
  btScalar cos;
  btScalar theta2;
  btScalar theta;
  btScalar mpq;
  btScalar t;
  btScalar v;
  btScalar max;
  int r;
  int q;
  int p;
  int step;
  float local_7c;
  int local_54;
  float local_48;
  float local_44;
  float local_34;
  float local_2c;
  int local_28;
  int local_24;
  uint local_20;
  int local_1c;
  
  setIdentity(in_RDI);
  local_1c = in_EDX;
  do {
    if (local_1c < 1) {
      return;
    }
    local_24 = 1;
    local_28 = 2;
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el);
    local_2c = btFabs(pbVar2[1]);
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el);
    bVar3 = btFabs(pbVar2[2]);
    if (local_2c < bVar3) {
      local_24 = 2;
      local_28 = 1;
      local_2c = bVar3;
    }
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + 1);
    bVar3 = btFabs(pbVar2[2]);
    bVar1 = local_2c < bVar3;
    if (bVar1) {
      local_24 = 2;
      local_28 = 0;
      local_2c = bVar3;
    }
    local_20 = (uint)bVar1;
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el);
    bVar3 = btFabs(*pbVar2);
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + 1);
    bVar4 = btFabs(pbVar2[1]);
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + 2);
    bVar5 = btFabs(pbVar2[2]);
    fVar6 = in_XMM0_Da * (bVar3 + bVar4 + bVar5);
    if (local_2c <= fVar6) {
      if (local_2c <= fVar6 * 1.1920929e-07) {
        return;
      }
      local_1c = 1;
    }
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + (int)local_20);
    fVar6 = pbVar2[local_24];
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + local_24);
    fVar7 = pbVar2[local_24];
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + (int)local_20);
    local_7c = (fVar7 - pbVar2[(int)local_20]) / (fVar6 * 2.0);
    fVar7 = local_7c * local_7c;
    if (8.388608e+07 <= fVar7 * fVar7) {
      local_34 = 1.0 / (local_7c * (0.5 / fVar7 + 2.0));
      local_44 = -(local_34 * 0.5) * local_34 + 1.0;
      local_48 = local_44 * local_34;
    }
    else {
      if (local_7c < 0.0) {
        bVar3 = btSqrt(0.0);
        local_7c = local_7c - bVar3;
      }
      else {
        bVar3 = btSqrt(0.0);
        local_7c = local_7c + bVar3;
      }
      local_7c = 1.0 / local_7c;
      local_34 = local_7c;
      bVar3 = btSqrt(0.0);
      local_44 = 1.0 / bVar3;
      local_48 = local_44 * local_7c;
    }
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + local_24);
    pbVar2[(int)local_20] = 0.0;
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + (int)local_20);
    pbVar2[local_24] = 0.0;
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + (int)local_20);
    pbVar2[(int)local_20] = -local_34 * fVar6 + pbVar2[(int)local_20];
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + local_24);
    pbVar2[local_24] = local_34 * fVar6 + pbVar2[local_24];
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + local_28);
    fVar6 = pbVar2[(int)local_20];
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + local_28);
    fVar7 = pbVar2[local_24];
    fVar8 = local_44 * fVar6 + -(local_48 * fVar7);
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + (int)local_20);
    pbVar2[local_28] = fVar8;
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + local_28);
    pbVar2[(int)local_20] = fVar8;
    fVar6 = local_44 * fVar7 + local_48 * fVar6;
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + local_24);
    pbVar2[local_28] = fVar6;
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + local_28);
    pbVar2[local_24] = fVar6;
    for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
      this_00 = operator[](in_RSI,local_54);
      pbVar2 = btVector3::operator_cast_to_float_(this_00);
      fVar6 = pbVar2[(int)local_20];
      pbVar2 = btVector3::operator_cast_to_float_(this_00);
      fVar7 = pbVar2[local_24];
      pbVar2 = btVector3::operator_cast_to_float_(this_00);
      pbVar2[(int)local_20] = local_44 * fVar6 + -(local_48 * fVar7);
      pbVar2 = btVector3::operator_cast_to_float_(this_00);
      pbVar2[local_24] = local_44 * fVar7 + local_48 * fVar6;
    }
    local_1c = local_1c + -1;
  } while( true );
}

Assistant:

void diagonalize(btMatrix3x3& rot, btScalar threshold, int maxSteps)
	{
		rot.setIdentity();
		for (int step = maxSteps; step > 0; step--)
		{
			// find off-diagonal element [p][q] with largest magnitude
			int p = 0;
			int q = 1;
			int r = 2;
			btScalar max = btFabs(m_el[0][1]);
			btScalar v = btFabs(m_el[0][2]);
			if (v > max)
			{
				q = 2;
				r = 1;
				max = v;
			}
			v = btFabs(m_el[1][2]);
			if (v > max)
			{
				p = 1;
				q = 2;
				r = 0;
				max = v;
			}

			btScalar t = threshold * (btFabs(m_el[0][0]) + btFabs(m_el[1][1]) + btFabs(m_el[2][2]));
			if (max <= t)
			{
				if (max <= SIMD_EPSILON * t)
				{
					return;
				}
				step = 1;
			}

			// compute Jacobi rotation J which leads to a zero for element [p][q] 
			btScalar mpq = m_el[p][q];
			btScalar theta = (m_el[q][q] - m_el[p][p]) / (2 * mpq);
			btScalar theta2 = theta * theta;
			btScalar cos;
			btScalar sin;
			if (theta2 * theta2 < btScalar(10 / SIMD_EPSILON))
			{
				t = (theta >= 0) ? 1 / (theta + btSqrt(1 + theta2))
					: 1 / (theta - btSqrt(1 + theta2));
				cos = 1 / btSqrt(1 + t * t);
				sin = cos * t;
			}
			else
			{
				// approximation for large theta-value, i.e., a nearly diagonal matrix
				t = 1 / (theta * (2 + btScalar(0.5) / theta2));
				cos = 1 - btScalar(0.5) * t * t;
				sin = cos * t;
			}

			// apply rotation to matrix (this = J^T * this * J)
			m_el[p][q] = m_el[q][p] = 0;
			m_el[p][p] -= t * mpq;
			m_el[q][q] += t * mpq;
			btScalar mrp = m_el[r][p];
			btScalar mrq = m_el[r][q];
			m_el[r][p] = m_el[p][r] = cos * mrp - sin * mrq;
			m_el[r][q] = m_el[q][r] = cos * mrq + sin * mrp;

			// apply rotation to rot (rot = rot * J)
			for (int i = 0; i < 3; i++)
			{
				btVector3& row = rot[i];
				mrp = row[p];
				mrq = row[q];
				row[p] = cos * mrp - sin * mrq;
				row[q] = cos * mrq + sin * mrp;
			}
		}
	}